

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall irr::gui::CGUITabControl::refreshSprites(CGUITabControl *this)

{
  long *plVar1;
  byte bVar2;
  undefined4 uVar3;
  long *plVar4;
  undefined8 uVar5;
  long *in_RDI;
  IGUISkin *skin;
  SColor color;
  SColor local_c [3];
  
  video::SColor::SColor(local_c,0xff,0xff,0xff,0xff);
  plVar4 = (long *)(**(code **)(*(long *)in_RDI[0x25] + 0x60))();
  if (plVar4 != (long *)0x0) {
    bVar2 = (**(code **)(*in_RDI + 0x90))();
    uVar5 = 0x15;
    if ((bVar2 & 1) != 0) {
      uVar5 = 0x12;
    }
    local_c[0].color = (**(code **)*plVar4)(plVar4,uVar5);
    if (in_RDI[0x2d] != 0) {
      plVar1 = (long *)in_RDI[0x2d];
      uVar3 = (**(code **)(*plVar4 + 0x50))(plVar4,7);
      (**(code **)(*plVar1 + 400))(plVar1,0,uVar3,local_c[0].color,0);
      plVar1 = (long *)in_RDI[0x2d];
      uVar3 = (**(code **)(*plVar4 + 0x50))(plVar4,7);
      (**(code **)(*plVar1 + 400))(plVar1,1,uVar3,local_c[0].color,0);
    }
    if (in_RDI[0x2e] != 0) {
      plVar1 = (long *)in_RDI[0x2e];
      uVar3 = (**(code **)(*plVar4 + 0x50))(plVar4,8);
      (**(code **)(*plVar1 + 400))(plVar1,0,uVar3,local_c[0].color,0);
      plVar1 = (long *)in_RDI[0x2e];
      uVar3 = (**(code **)(*plVar4 + 0x50))(plVar4,8);
      (**(code **)(*plVar1 + 400))(plVar1,1,uVar3,local_c[0].color,0);
    }
  }
  return;
}

Assistant:

void CGUITabControl::refreshSprites()
{
	video::SColor color(255, 255, 255, 255);
	IGUISkin *skin = Environment->getSkin();
	if (skin) {
		color = skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL);

		if (UpButton) {
			UpButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_LEFT), color);
			UpButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_LEFT), color);
		}

		if (DownButton) {
			DownButton->setSprite(EGBS_BUTTON_UP, skin->getIcon(EGDI_CURSOR_RIGHT), color);
			DownButton->setSprite(EGBS_BUTTON_DOWN, skin->getIcon(EGDI_CURSOR_RIGHT), color);
		}
	}
}